

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

double __thiscall ary::BinaryPattern::match(BinaryPattern *this,Mat *src,int *orientation)

{
  _InputArray *p_Var1;
  pointer pMVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Scalar mean_int;
  Scalar std_int;
  Scalar mean_ext;
  Mat interior;
  Scalar std_ext;
  double local_1c0;
  _InputArray local_1b8;
  _InputArray local_198;
  _OutputArray local_180;
  double local_168;
  double local_158;
  int *local_140;
  Range local_138;
  undefined8 uStack_130;
  double local_128 [5];
  double dStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d8 [4];
  Mat local_b8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_d8[2] = 0.0;
  local_d8[3] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_1b8.flags = 0x19;
  local_1b8._4_4_ = 0x4b;
  local_198.flags = 0x19;
  local_198._4_4_ = 0x4b;
  local_140 = orientation;
  cv::Mat::Mat(&local_b8,src,(Range *)&local_1b8,(Range *)&local_198);
  local_1b8.sz.width = 0;
  local_1b8.sz.height = 0;
  local_1b8.flags = 0x1010000;
  local_198.flags = -0x3dfdfffa;
  local_198.sz.width = 1;
  local_198.sz.height = 4;
  local_180.super__InputArray.flags = -0x3dfdfffa;
  local_180.super__InputArray.sz.width = 1;
  local_180.super__InputArray.sz.height = 4;
  local_1b8.obj = src;
  local_198.obj = local_d8;
  local_180.super__InputArray.obj = &local_58;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_1b8,(_OutputArray *)&local_198,&local_180,p_Var1);
  local_1b8.sz.width = 0;
  local_1b8.sz.height = 0;
  local_1b8.flags = 0x1010000;
  local_198.flags = -0x3dfdfffa;
  local_198.obj = local_128;
  local_198.sz.width = 1;
  local_198.sz.height = 4;
  local_180.super__InputArray.flags = -0x3dfdfffa;
  local_180.super__InputArray.obj = &local_f8;
  local_180.super__InputArray.sz.width = 1;
  local_180.super__InputArray.sz.height = 4;
  local_1b8.obj = &local_b8;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_1b8,(_OutputArray *)&local_198,&local_180,p_Var1);
  local_1c0 = -1.0;
  if (local_d8[0] <= local_128[0]) {
    local_1b8.sz.width = 0;
    local_1b8.sz.height = 0;
    local_1b8.flags = 0x1010000;
    local_1b8.obj = &local_b8;
    p_Var1 = (_InputArray *)cv::noArray();
    local_168 = (double)cv::norm(&local_1b8,4,p_Var1);
    pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish != pMVar2) {
      local_168 = local_168 * local_168;
      local_1c0 = -1.0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        local_1b8.obj =
             (void *)((long)&((Mat *)(&((Mat *)(&((Mat *)(&pMVar2->step + -3))->step + -3))->step +
                                     -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_1b8.sz.width = 0;
        local_1b8.sz.height = 0;
        local_1b8.flags = 0x1010000;
        p_Var1 = (_InputArray *)cv::noArray();
        local_158 = (double)cv::norm(&local_1b8,4,p_Var1);
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
LAB_0011459f:
          uVar3 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar6);
          cv::Mat::~Mat(&local_b8);
          _Unwind_Resume(uVar3);
        }
        local_198.obj =
             (void *)((long)&((Mat *)(&pMVar2->step + -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_198.sz.width = 0;
        local_198.sz.height = 0;
        local_198.flags = 0x1010000;
        cv::noArray();
        cv::mean(&local_1b8,&local_198);
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
          goto LAB_0011459f;
        }
        local_138.start = local_1b8.flags;
        local_138.end = local_1b8._4_4_;
        uStack_130 = 0;
        local_1b8.obj =
             (void *)((long)&((Mat *)(&pMVar2->step + -3))->step + lVar5 + 0xffffffffffffffb8U);
        local_1b8.sz.width = 0;
        local_1b8.sz.height = 0;
        local_1b8.flags = 0x1010000;
        dVar7 = (double)cv::Mat::dot((_InputArray *)&local_b8);
        dVar9 = local_128[0] * -2500.0;
        dVar8 = (local_128[0] * dVar9 + local_168) *
                ((double)local_138 * (double)local_138 * -2500.0 + local_158 * local_158);
        if (dVar8 < 0.0) {
          local_158 = dVar7;
          local_128[4] = (double)local_138 * -2500.0;
          dStack_100 = dVar9;
          dVar8 = sqrt(dVar8);
          dVar7 = local_158;
          dVar9 = dStack_100;
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar8 = (dVar9 * (double)local_138 + dVar7) / dVar8;
        if (local_1c0 < dVar8) {
          *local_140 = (int)uVar6;
          local_1c0 = dVar8;
        }
        uVar6 = uVar6 + 1;
        pMVar2 = (this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->markers).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pMVar2 >> 5) * -0x5555555555555555
        ;
        lVar5 = lVar5 + 0x60;
      } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
    }
  }
  cv::Mat::~Mat(&local_b8);
  return local_1c0;
}

Assistant:

double BinaryPattern::match(const Mat& src, int& orientation) {

	int i;
	double tempsim;
	double N = (double)(PATTERN_SIZE * PATTERN_SIZE / 4);
	double nom, den;

	Scalar mean_ext, std_ext, mean_int, std_int;

	Mat interior = src(cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4), cv::Range(PATTERN_SIZE / 4, 3 * PATTERN_SIZE / 4));

	meanStdDev(src, mean_ext, std_ext);
	meanStdDev(interior, mean_int, std_int);

	//printf("ext: %f int: %f \n", mean_ext.val[0], mean_int.val[0]);

	if ((mean_ext.val[0] > mean_int.val[0]))
		return -1;

	double normSrcSq = pow(norm(interior), 2);

	//zero_mean_mode;
	int zero_mean_mode = 1;

	//use correlation coefficient as a robust similarity measure
	double confidence = -1.0;
	for (i = 0; i < markers.size(); i++) {

		double const nnn = pow(norm(markers.at(i)), 2);

		if (zero_mean_mode == 1) {

			double const mmm = mean(markers.at(i)).val[0];

			nom = interior.dot(markers.at(i)) - (N * mean_int.val[0] * mmm);
			den = sqrt( (normSrcSq - (N * mean_int.val[0] * mean_int.val[0]) ) * (nnn - (N * mmm * mmm)));
			tempsim = nom / den;
		}
		else
		{
			tempsim = interior.dot(markers.at(i)) / (sqrt(normSrcSq * nnn));
		}

		if (tempsim > confidence) {
			confidence = tempsim;
			orientation = i;
		}
	}

	return confidence;
}